

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::GetType(VirtualMachine *this)

{
  Variable VVar1;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *str;
  Variable top;
  VirtualMachine *this_local;
  
  top.field_1 = (anon_union_8_6_52c89740_for_Variable_1)this;
  VVar1 = popOpStack(this);
  top._0_8_ = VVar1.field_1;
  str._0_4_ = VVar1.type;
  local_28 = Heap::NewString_abi_cxx11_(&this->heap);
  switch((VariableType)str) {
  case Undefined:
    std::__cxx11::string::assign((char *)local_28);
    break;
  case Integer:
    std::__cxx11::string::assign((char *)local_28);
    break;
  case Boolean:
    std::__cxx11::string::assign((char *)local_28);
    break;
  case Float:
    std::__cxx11::string::assign((char *)local_28);
    break;
  case String:
    std::__cxx11::string::assign((char *)local_28);
    break;
  case Object:
    std::__cxx11::string::assign((char *)local_28);
    break;
  case Function:
    std::__cxx11::string::assign((char *)local_28);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Unknown varible type at variableEquals",&local_49);
    panic(this,&local_48);
  }
  pushString(this,local_28);
  advance(this);
  return;
}

Assistant:

void runtime::VirtualMachine::GetType() {
  Variable top = this->popOpStack();

  auto str = this->heap.NewString();

  switch (top.type) {
    case VariableType::Integer: {
      str->assign("integer");
      break;
    }
    case VariableType::Float: {
      str->assign("float");
      break;
    }
    case VariableType::Function: {
      str->assign("function");
      break;
    }
    case VariableType::Object: {
      str->assign("object");
      break;
    }
    case VariableType::String: {
      str->assign("string");
      break;
    }
    case VariableType::Undefined: {
      str->assign("undefined");
      break;
    }
    case VariableType::Boolean: {
      str->assign("boolean");
      break;
    }
    default: {
      this->panic("Unknown varible type at variableEquals");
    }
  }

  this->pushString(str);
  this->advance();
}